

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool __thiscall cfd::core::Psbt::IsFindGlobalXpubkey(Psbt *this,ExtPubkey *key)

{
  wally_psbt *psbt;
  byte bVar1;
  ByteData local_98;
  ByteData local_70;
  undefined1 local_58 [8];
  ByteData key_data;
  ByteData key_top;
  uint8_t xpub_key;
  bool is_find;
  wally_psbt *psbt_pointer;
  ExtPubkey *key_local;
  Psbt *this_local;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  ByteData::ByteData((ByteData *)
                     &key_data.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (uint8_t *)
                     ((long)&key_top.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6),1);
  ExtPubkey::GetData(&local_70,key);
  ByteData::Concat<cfd::core::ByteData>
            ((ByteData *)local_58,
             (ByteData *)
             &key_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_70);
  ByteData::~ByteData(&local_70);
  GetPsbtGlobal(&local_98,(ByteData *)local_58,psbt,
                (bool *)((long)&key_top.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ByteData::~ByteData(&local_98);
  bVar1 = key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  ByteData::~ByteData((ByteData *)local_58);
  ByteData::~ByteData((ByteData *)
                      &key_data.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Psbt::IsFindGlobalXpubkey(const ExtPubkey &key) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetData());
  GetPsbtGlobal(key_data, psbt_pointer, &is_find);
  return is_find;
}